

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::TableBuilderArgsDefnType
          (string *__return_storage_ptr__,RustGenerator *this,FieldDef *field,string *lifetime)

{
  FullType FVar1;
  Value *type_00;
  allocator<char> local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined1 local_308 [8];
  string typname_5;
  undefined1 local_2c8 [8];
  string typname_4;
  undefined1 local_288 [8];
  string typname_3;
  Type local_248;
  undefined1 local_228 [8];
  string typname_2;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string typname_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string typname;
  string local_70;
  anon_class_8_1_c271e40b *local_50;
  anon_class_8_1_c271e40b WrapUOffsetsVector;
  anon_class_16_2_f0a7ae83 WrapVector;
  anon_class_8_1_a7e8901a WrapOption;
  Type *type;
  string *lifetime_local;
  FieldDef *field_local;
  RustGenerator *this_local;
  
  type_00 = &field->value;
  WrapUOffsetsVector.WrapVector = (anon_class_16_2_f0a7ae83 *)&WrapVector.lifetime;
  local_50 = &WrapUOffsetsVector;
  WrapVector.WrapOption = (anon_class_8_1_a7e8901a *)lifetime;
  WrapVector.lifetime = (string *)field;
  FVar1 = anon_unknown_26::GetFullType(&type_00->type);
  switch(FVar1) {
  case ftInteger:
  case ftFloat:
  case ftBool:
    GetTypeBasic_abi_cxx11_(&local_70,this,&type_00->type);
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&WrapVector.lifetime,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case ftStruct:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_a0,this,&((field->value).type.struct_def)->super_Definition);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_1.field_2 + 8),"&",lifetime);
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typname_1.field_2 + 8)," ");
    std::operator+(&local_c0,&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&WrapVector.lifetime,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)(typname_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_a0);
    break;
  case ftTable:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_120,this,&((field->value).type.struct_def)->super_Definition);
    std::operator+(&local_1a0,"flatbuffers::WIPOffset<",(string *)local_120);
    std::operator+(&local_180,&local_1a0,"<");
    std::operator+(&local_160,&local_180,lifetime);
    std::operator+(&local_140,&local_160,">>");
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&WrapVector.lifetime,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)local_120);
    break;
  case ftEnumKey:
  case ftUnionKey:
    WrapInNameSpace_abi_cxx11_(&local_200,this,&((field->value).type.enum_def)->super_Definition);
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&WrapVector.lifetime,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    break;
  case ftUnionValue:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "Option<flatbuffers::WIPOffset<flatbuffers::UnionWIPOffset>>",
               (allocator<char> *)(typname_2.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(typname_2.field_2._M_local_buf + 0xf));
    break;
  case ftString:
    std::operator+(&local_1e0,"flatbuffers::WIPOffset<&",lifetime);
    std::operator+(&local_1c0,&local_1e0," str>");
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,&WrapVector.lifetime,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    break;
  case ftVectorOfInteger:
  case ftVectorOfFloat:
  case ftVectorOfBool:
    Type::VectorType(&local_248,&type_00->type);
    GetTypeBasic_abi_cxx11_((string *)local_228,this,&local_248);
    std::__cxx11::string::string((string *)(typname_3.field_2._M_local_buf + 8),(string *)local_228)
    ;
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#2}::operator()::string__const
              (__return_storage_ptr__,&WrapUOffsetsVector,(string *)((long)&typname_3.field_2 + 8));
    std::__cxx11::string::~string((string *)(typname_3.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_228);
    break;
  case ftVectorOfEnumKey:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_288,this,&((field->value).type.enum_def)->super_Definition);
    std::__cxx11::string::string((string *)(typname_4.field_2._M_local_buf + 8),(string *)local_288)
    ;
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#2}::operator()::string__const
              (__return_storage_ptr__,&WrapUOffsetsVector,(string *)((long)&typname_4.field_2 + 8));
    std::__cxx11::string::~string((string *)(typname_4.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_288);
    break;
  case ftVectorOfStruct:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_2c8,this,&((field->value).type.struct_def)->super_Definition);
    std::__cxx11::string::string((string *)(typname_5.field_2._M_local_buf + 8),(string *)local_2c8)
    ;
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#2}::operator()::string__const
              (__return_storage_ptr__,&WrapUOffsetsVector,(string *)((long)&typname_5.field_2 + 8));
    std::__cxx11::string::~string((string *)(typname_5.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_2c8);
    break;
  case ftVectorOfTable:
    WrapInNameSpace_abi_cxx11_
              ((string *)local_308,this,&((field->value).type.struct_def)->super_Definition);
    std::operator+(&local_368,(string *)local_308,"<");
    std::operator+(&local_348,&local_368,lifetime);
    std::operator+(&local_328,&local_348,">");
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#3}::operator()::string__const
              (__return_storage_ptr__,&local_50,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)local_308);
    break;
  case ftVectorOfString:
    std::operator+(&local_3a8,"&",lifetime);
    std::operator+(&local_388,&local_3a8," str");
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#3}::operator()::string__const
              (__return_storage_ptr__,&local_50,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    break;
  case ftVectorOfUnionValue:
    std::operator+(&local_3e8,"flatbuffers::Table<",lifetime);
    std::operator+(&local_3c8,&local_3e8,">");
    TableBuilderArgsDefnType(flatbuffers::FieldDef_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#3}::operator()::string__const
              (__return_storage_ptr__,&local_50,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    break;
  case ftArrayOfBuiltin:
  case ftArrayOfEnum:
  case ftArrayOfStruct:
    __assert_fail("false && \"arrays are not supported within tables\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x4be,
                  "std::string flatbuffers::rust::RustGenerator::TableBuilderArgsDefnType(const FieldDef &, const std::string &)"
                 );
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INVALID_CODE_GENERATION",&local_3e9);
    std::allocator<char>::~allocator(&local_3e9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TableBuilderArgsDefnType(const FieldDef &field,
                                       const std::string &lifetime) {
    const Type &type = field.value.type;
    auto WrapOption = [&](std::string s) {
      return IsOptionalToBuilder(field) ? "Option<" + s + ">" : s;
    };
    auto WrapVector = [&](std::string ty) {
      return WrapOption("flatbuffers::WIPOffset<flatbuffers::Vector<" +
                        lifetime + ", " + ty + ">>");
    };
    auto WrapUOffsetsVector = [&](std::string ty) {
      return WrapVector("flatbuffers::ForwardsUOffset<" + ty + ">");
    };

    switch (GetFullType(type)) {
      case ftInteger:
      case ftFloat:
      case ftBool: {
        return WrapOption(GetTypeBasic(type));
      }
      case ftStruct: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapOption("&" + lifetime + " " + typname);
      }
      case ftTable: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapOption("flatbuffers::WIPOffset<" + typname + "<" + lifetime +
                          ">>");
      }
      case ftString: {
        return WrapOption("flatbuffers::WIPOffset<&" + lifetime + " str>");
      }
      case ftEnumKey:
      case ftUnionKey: {
        return WrapOption(WrapInNameSpace(*type.enum_def));
      }
      case ftUnionValue: {
        return "Option<flatbuffers::WIPOffset<flatbuffers::UnionWIPOffset>>";
      }

      case ftVectorOfInteger:
      case ftVectorOfBool:
      case ftVectorOfFloat: {
        const auto typname = GetTypeBasic(type.VectorType());
        return WrapVector(typname);
      }
      case ftVectorOfEnumKey: {
        const auto typname = WrapInNameSpace(*type.enum_def);
        return WrapVector(typname);
      }
      case ftVectorOfStruct: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapVector(typname);
      }
      case ftVectorOfTable: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapUOffsetsVector(typname + "<" + lifetime + ">");
      }
      case ftVectorOfString: {
        return WrapUOffsetsVector("&" + lifetime + " str");
      }
      case ftVectorOfUnionValue: {
        return WrapUOffsetsVector("flatbuffers::Table<" + lifetime + ">");
      }
      case ftArrayOfEnum:
      case ftArrayOfStruct:
      case ftArrayOfBuiltin: {
        FLATBUFFERS_ASSERT(false && "arrays are not supported within tables");
        return "ARRAYS_NOT_SUPPORTED_IN_TABLES";
      }
    }
    return "INVALID_CODE_GENERATION";  // for return analysis
  }